

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSourceArrayLoader.cpp
# Opt level: O3

SourceBase * __thiscall
COLLADASaxFWL::SourceArrayLoader::getSourceById(SourceArrayLoader *this,String *sourceId)

{
  SourceBase *pSVar1;
  bool bVar2;
  ulong uVar3;
  
  if ((this->mSourceArray).mCount != 0) {
    uVar3 = 0;
    do {
      pSVar1 = (this->mSourceArray).mData[uVar3];
      bVar2 = COLLADABU::Utils::equals(&pSVar1->mId,sourceId);
      if (bVar2) {
        return pSVar1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (this->mSourceArray).mCount);
  }
  return (SourceBase *)0x0;
}

Assistant:

SourceBase* SourceArrayLoader::getSourceById ( const String& sourceId ) 
    {
        for ( size_t i=0; i<mSourceArray.getCount (); ++i )
        {
            SourceBase* source = mSourceArray [ i ];
            if ( COLLADABU::Utils::equals ( source->getId (), sourceId ) )
                return source;
        }
        return 0;
    }